

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine_test.c
# Opt level: O0

int test_no_ascii(void)

{
  statemachine_definition *def_00;
  statemachine_ctx *ctx;
  statemachine_ctx *sm;
  statemachine_definition *def;
  
  def_00 = statemachine_definition_new(10);
  ctx = statemachine_new(def_00,(void *)0x0);
  statemachine_definition_populate(def_00,simple_state_transitions,simple_states_internal_names);
  if (ctx->current_state != 0) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0xf6,"sm->current_state == SIMPLE_STATE_A");
    if (ctx->current_state == 0) {
      exit(1);
    }
    __assert_fail("sm->current_state == SIMPLE_STATE_A",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0xf6,"int test_no_ascii()");
  }
  statemachine_parse(ctx,anon_var_dwarf_376,3);
  if (ctx->current_state != 1) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0xf9,"sm->current_state == SIMPLE_STATE_B");
    if (ctx->current_state == 1) {
      exit(1);
    }
    __assert_fail("sm->current_state == SIMPLE_STATE_B",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0xf9,"int test_no_ascii()");
  }
  statemachine_parse(ctx,anon_var_dwarf_376,3);
  if (ctx->current_state != 2) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0xfc,"sm->current_state == SIMPLE_STATE_C");
    if (ctx->current_state == 2) {
      exit(1);
    }
    __assert_fail("sm->current_state == SIMPLE_STATE_C",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0xfc,"int test_no_ascii()");
  }
  statemachine_parse(ctx,anon_var_dwarf_380,1);
  if (ctx->current_state != 1) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0xff,"sm->current_state == SIMPLE_STATE_B");
    if (ctx->current_state == 1) {
      exit(1);
    }
    __assert_fail("sm->current_state == SIMPLE_STATE_B",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0xff,"int test_no_ascii()");
  }
  statemachine_parse(ctx,anon_var_dwarf_38a,2);
  if (ctx->current_state == 3) {
    statemachine_delete(ctx);
    return 0;
  }
  printf("%s: %d: ASSERT FAILED: %s\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
         ,0x102,"sm->current_state == SIMPLE_STATE_D");
  if (ctx->current_state == 3) {
    exit(1);
  }
  __assert_fail("sm->current_state == SIMPLE_STATE_D",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                ,0x102,"int test_no_ascii()");
}

Assistant:

int test_no_ascii()
{
  statemachine_definition *def;
  statemachine_ctx *sm;
  def = statemachine_definition_new(NUM_STATES);
  sm = statemachine_new(def, NULL);

  statemachine_definition_populate(def, simple_state_transitions,
                                   simple_states_internal_names);

  ASSERT(sm->current_state == SIMPLE_STATE_A);

  statemachine_parse(sm, "\xf0\xf0\xf1", 3);
  ASSERT(sm->current_state == SIMPLE_STATE_B);

  statemachine_parse(sm, "\xf0\xf0\xf1", 3);
  ASSERT(sm->current_state == SIMPLE_STATE_C);

  statemachine_parse(sm, "\xf2", 1);
  ASSERT(sm->current_state == SIMPLE_STATE_B);

  statemachine_parse(sm, "\xf1\xf1", 2);
  ASSERT(sm->current_state == SIMPLE_STATE_D);

  statemachine_delete(sm);
  return 0;

}